

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void * sqlite3_errmsg16(sqlite3 *db)

{
  Lookaside *pLVar1;
  uint err_code;
  u16 uVar2;
  int iVar3;
  char *zFormat;
  ulong uVar4;
  u16 *puVar5;
  
  if (db == (sqlite3 *)0x0) {
    puVar5 = sqlite3_errmsg16::outOfMem;
  }
  else {
    iVar3 = sqlite3SafetyCheckSickOrOk(db);
    if (iVar3 == 0) {
      puVar5 = sqlite3_errmsg16::misuse;
    }
    else {
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
      }
      if (db->mallocFailed == '\0') {
        puVar5 = (u16 *)sqlite3ValueText(db->pErr,'\x02');
        if (puVar5 == (u16 *)0x0) {
          err_code = db->errCode;
          uVar4 = (ulong)err_code;
          if (uVar4 == 0x204) {
            zFormat = "abort due to ROLLBACK";
          }
          else if (err_code == 0x65) {
            zFormat = "no more rows available";
          }
          else if (err_code == 100) {
            zFormat = "another row available";
          }
          else {
            zFormat = "unknown error";
            if (((uint)(uVar4 & 0xff) < 0x1d) && ((0x1410004UL >> (uVar4 & 0x3f) & 1) == 0)) {
              zFormat = *(char **)(sqlite3ErrStr_aMsg + (uVar4 & 0xff) * 8);
            }
          }
          sqlite3ErrorWithMsg(db,err_code,zFormat);
          puVar5 = (u16 *)sqlite3ValueText(db->pErr,'\x02');
        }
        if ((db->mallocFailed != '\0') && (db->nVdbeExec == 0)) {
          db->mallocFailed = '\0';
          (db->u1).isInterrupted = 0;
          pLVar1 = &db->lookaside;
          pLVar1->bDisable = pLVar1->bDisable - 1;
          if (pLVar1->bDisable == 0) {
            uVar2 = (db->lookaside).szTrue;
          }
          else {
            uVar2 = 0;
          }
          (db->lookaside).sz = uVar2;
        }
      }
      else {
        puVar5 = sqlite3_errmsg16::outOfMem;
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
    }
  }
  return puVar5;
}

Assistant:

SQLITE_API const void *sqlite3_errmsg16(sqlite3 *db){
  static const u16 outOfMem[] = {
    'o', 'u', 't', ' ', 'o', 'f', ' ', 'm', 'e', 'm', 'o', 'r', 'y', 0
  };
  static const u16 misuse[] = {
    'b', 'a', 'd', ' ', 'p', 'a', 'r', 'a', 'm', 'e', 't', 'e', 'r', ' ',
    'o', 'r', ' ', 'o', 't', 'h', 'e', 'r', ' ', 'A', 'P', 'I', ' ',
    'm', 'i', 's', 'u', 's', 'e', 0
  };

  const void *z;
  if( !db ){
    return (void *)outOfMem;
  }
  if( !sqlite3SafetyCheckSickOrOk(db) ){
    return (void *)misuse;
  }
  sqlite3_mutex_enter(db->mutex);
  if( db->mallocFailed ){
    z = (void *)outOfMem;
  }else{
    z = sqlite3_value_text16(db->pErr);
    if( z==0 ){
      sqlite3ErrorWithMsg(db, db->errCode, sqlite3ErrStr(db->errCode));
      z = sqlite3_value_text16(db->pErr);
    }
    /* A malloc() may have failed within the call to sqlite3_value_text16()
    ** above. If this is the case, then the db->mallocFailed flag needs to
    ** be cleared before returning. Do this directly, instead of via
    ** sqlite3ApiExit(), to avoid setting the database handle error message.
    */
    sqlite3OomClear(db);
  }
  sqlite3_mutex_leave(db->mutex);
  return z;
}